

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventAgentTest.cpp
# Opt level: O0

bool __thiscall TestClass::SyncRetFunc1(TestClass *this,uint64_t *p1)

{
  ulong uVar1;
  SyncRetEventAgent1<TestClass,_bool,_unsigned_long_&> *this_00;
  ssize_t sVar2;
  size_t __n;
  void *__buf;
  int __flags;
  SyncRetEventAgent1<TestClass,_bool,_unsigned_long_&> *agent;
  bool result;
  uint64_t *p1_local;
  TestClass *this_local;
  
  uVar1 = EventDispatcher::isThreadCurrent();
  if ((uVar1 & 1) == 0) {
    this_00 = (SyncRetEventAgent1<TestClass,_bool,_unsigned_long_&> *)
              operator_new(0x38,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/eventAgentTest.cpp"
                           ,0xf8);
    __flags = (int)p1;
    __n = 0;
    SyncRetEventAgent1<TestClass,_bool,_unsigned_long_&>::SyncRetEventAgent1
              (this_00,this,0x10d260,(unsigned_long *)0x0);
    sVar2 = SyncRetEventAgent<bool>::send
                      ((SyncRetEventAgent<bool> *)this_00,(int)this + 8,__buf,__n,__flags);
    this_local._7_1_ = (bool)((byte)sVar2 & 1);
  }
  else {
    *p1 = *p1 + 0x400;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool SyncRetFunc1(uint64_t &p1)
	{
		if (not mEventThread.isThreadCurrent())
		{
			bool result = false;
			SyncRetEventAgent1<TestClass, bool, uint64_t &>* agent =
				jh_new SyncRetEventAgent1<TestClass, bool, uint64_t &>(this, &TestClass::SyncRetFunc1,
					p1);
			result = agent->send(&mEventThread);
			LOG_INFO("RetVal(%d) p1(%llu)", result, p1);
			return result;
		}
		
		LOG_INFO("Received p1(%llu)", p1);
		p1+=1024;
		return true;
	}